

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5TriTokenize(Fts5Tokenizer *pTok,void *pCtx,int unusedFlags,char *pText,int nText,
                   _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  byte bVar1;
  int iVar2;
  byte *in_RCX;
  byte *pbVar3;
  byte *pbVar4;
  undefined8 in_RSI;
  int *in_RDI;
  int in_R8D;
  code *in_R9;
  long in_FS_OFFSET;
  bool bVar5;
  char *z1;
  int iNext;
  u32 iCode;
  uchar *zEof;
  uchar *zIn;
  int ii;
  char *zOut;
  int rc;
  TrigramTokenizer *p;
  int aStart [3];
  char aBuf [32];
  byte *local_b0;
  byte *local_a8;
  uint local_9c;
  int local_84;
  byte *local_80;
  int local_38;
  undefined8 local_34;
  int local_2c;
  undefined8 local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = (byte *)&local_28;
  if (in_RCX == (byte *)0x0) {
    local_b0 = (byte *)0x0;
  }
  else {
    local_b0 = in_RCX + in_R8D;
  }
  local_34 = &DAT_aaaaaaaaaaaaaaaa;
  local_2c = -0x55555556;
  pbVar3 = in_RCX;
  for (local_84 = 0; pbVar4 = pbVar3, local_84 < 3; local_84 = local_84 + 1) {
    do {
      *(int *)((long)&local_34 + (long)local_84 * 4) = (int)pbVar4 - (int)in_RCX;
      if (local_b0 <= pbVar4) {
        local_38 = 0;
        goto LAB_0029095c;
      }
      pbVar3 = pbVar4 + 1;
      local_9c = (uint)*pbVar4;
      if (0xbf < local_9c) {
        local_9c = (uint)""[local_9c - 0xc0];
        while( true ) {
          bVar5 = false;
          if (pbVar3 < local_b0) {
            bVar5 = (*pbVar3 & 0xc0) == 0x80;
          }
          if (!bVar5) break;
          local_9c = local_9c * 0x40 + (*pbVar3 & 0x3f);
          pbVar3 = pbVar3 + 1;
        }
        if (((local_9c < 0x80) || ((local_9c & 0xfffff800) == 0xd800)) ||
           ((local_9c & 0xfffffffe) == 0xfffe)) {
          local_9c = 0xfffd;
        }
      }
      if (*in_RDI != 0) {
        local_9c = sqlite3Fts5UnicodeFold((int)((ulong)pbVar3 >> 0x20),(int)pbVar3);
      }
      pbVar4 = pbVar3;
    } while (local_9c == 0);
    bVar1 = (byte)local_9c;
    if (local_9c < 0x80) {
      *local_80 = bVar1;
      local_80 = local_80 + 1;
    }
    else if (local_9c < 0x800) {
      pbVar4 = local_80 + 1;
      *local_80 = ((byte)(local_9c >> 6) & 0x1f) - 0x40;
      local_80 = local_80 + 2;
      *pbVar4 = (bVar1 & 0x3f) + 0x80;
    }
    else if (local_9c < 0x10000) {
      *local_80 = ((byte)(local_9c >> 0xc) & 0xf) - 0x20;
      pbVar4 = local_80 + 2;
      local_80[1] = ((byte)(local_9c >> 6) & 0x3f) + 0x80;
      local_80 = local_80 + 3;
      *pbVar4 = (bVar1 & 0x3f) + 0x80;
    }
    else {
      *local_80 = ((byte)(local_9c >> 0x12) & 7) - 0x10;
      local_80[1] = ((byte)(local_9c >> 0xc) & 0x3f) + 0x80;
      pbVar4 = local_80 + 3;
      local_80[2] = ((byte)(local_9c >> 6) & 0x3f) + 0x80;
      local_80 = local_80 + 4;
      *pbVar4 = (bVar1 & 0x3f) + 0x80;
    }
  }
LAB_00290580:
  iVar2 = (int)pbVar3 - (int)in_RCX;
  if (pbVar3 < local_b0) goto LAB_002905aa;
  local_9c = 0;
  goto LAB_002906a5;
LAB_002905aa:
  pbVar4 = pbVar3 + 1;
  local_9c = (uint)*pbVar3;
  if (0xbf < local_9c) {
    local_9c = (uint)""[local_9c - 0xc0];
    while( true ) {
      bVar5 = false;
      if (pbVar4 < local_b0) {
        bVar5 = (*pbVar4 & 0xc0) == 0x80;
      }
      if (!bVar5) break;
      local_9c = local_9c * 0x40 + (*pbVar4 & 0x3f);
      pbVar4 = pbVar4 + 1;
    }
    if (((local_9c < 0x80) || ((local_9c & 0xfffff800) == 0xd800)) ||
       ((local_9c & 0xfffffffe) == 0xfffe)) {
      local_9c = 0xfffd;
    }
  }
  if (*in_RDI != 0) {
    local_9c = sqlite3Fts5UnicodeFold((int)((ulong)pbVar4 >> 0x20),(int)pbVar4);
  }
  pbVar3 = pbVar4;
  if (local_9c != 0) {
LAB_002906a5:
    local_38 = (*in_R9)(in_RSI,0,&local_28,(long)local_80 - (long)&local_28,
                        (ulong)local_34 & 0xffffffff,iVar2);
    if ((local_9c == 0) || (local_38 != 0)) {
LAB_0029095c:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_38;
    }
    local_a8 = (byte *)((long)&local_28 + 1);
    if (0xbf < (byte)local_28) {
      for (; (*local_a8 & 0xc0) == 0x80; local_a8 = local_a8 + 1) {
      }
    }
    memmove(&local_28,local_a8,(long)local_80 - (long)local_a8);
    pbVar4 = local_80 + -((long)local_a8 - (long)&local_28);
    bVar1 = (byte)local_9c;
    if (local_9c < 0x80) {
      local_80 = pbVar4 + 1;
      *pbVar4 = bVar1;
    }
    else if (local_9c < 0x800) {
      *pbVar4 = ((byte)(local_9c >> 6) & 0x1f) - 0x40;
      local_80 = pbVar4 + 2;
      pbVar4[1] = (bVar1 & 0x3f) + 0x80;
    }
    else if (local_9c < 0x10000) {
      *pbVar4 = ((byte)(local_9c >> 0xc) & 0xf) - 0x20;
      pbVar4[1] = ((byte)(local_9c >> 6) & 0x3f) + 0x80;
      local_80 = pbVar4 + 3;
      pbVar4[2] = (bVar1 & 0x3f) + 0x80;
    }
    else {
      *pbVar4 = ((byte)(local_9c >> 0x12) & 7) - 0x10;
      pbVar4[1] = ((byte)(local_9c >> 0xc) & 0x3f) + 0x80;
      pbVar4[2] = ((byte)(local_9c >> 6) & 0x3f) + 0x80;
      local_80 = pbVar4 + 4;
      pbVar4[3] = (bVar1 & 0x3f) + 0x80;
    }
    local_34 = (undefined1 *)CONCAT44(local_2c,local_34._4_4_);
    local_2c = iVar2;
  }
  goto LAB_00290580;
}

Assistant:

static int fts5TriTokenize(
  Fts5Tokenizer *pTok,
  void *pCtx,
  int unusedFlags,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int, int, int)
){
  TrigramTokenizer *p = (TrigramTokenizer*)pTok;
  int rc = SQLITE_OK;
  char aBuf[32];
  char *zOut = aBuf;
  int ii;
  const unsigned char *zIn = (const unsigned char*)pText;
  const unsigned char *zEof = (zIn ? &zIn[nText] : 0);
  u32 iCode = 0;
  int aStart[3];                  /* Input offset of each character in aBuf[] */

  UNUSED_PARAM(unusedFlags);

  /* Populate aBuf[] with the characters for the first trigram. */
  for(ii=0; ii<3; ii++){
    do {
      aStart[ii] = zIn - (const unsigned char*)pText;
      if( zIn>=zEof ) return SQLITE_OK;
      READ_UTF8(zIn, zEof, iCode);
      if( p->bFold ) iCode = sqlite3Fts5UnicodeFold(iCode, p->iFoldParam);
    }while( iCode==0 );
    WRITE_UTF8(zOut, iCode);
  }

  /* At the start of each iteration of this loop:
  **
  **  aBuf:      Contains 3 characters. The 3 characters of the next trigram.
  **  zOut:      Points to the byte following the last character in aBuf.
  **  aStart[3]: Contains the byte offset in the input text corresponding
  **             to the start of each of the three characters in the buffer.
  */
  assert( zIn<=zEof );
  while( 1 ){
    int iNext;                    /* Start of character following current tri */
    const char *z1;

    /* Read characters from the input up until the first non-diacritic */
    do {
      iNext = zIn - (const unsigned char*)pText;
      if( zIn>=zEof ){
        iCode = 0;
        break;
      }
      READ_UTF8(zIn, zEof, iCode);
      if( p->bFold ) iCode = sqlite3Fts5UnicodeFold(iCode, p->iFoldParam);
    }while( iCode==0 );

    /* Pass the current trigram back to fts5 */
    rc = xToken(pCtx, 0, aBuf, zOut-aBuf, aStart[0], iNext);
    if( iCode==0 || rc!=SQLITE_OK ) break;

    /* Remove the first character from buffer aBuf[]. Append the character
    ** with codepoint iCode.  */
    z1 = aBuf;
    FTS5_SKIP_UTF8(z1);
    memmove(aBuf, z1, zOut - z1);
    zOut -= (z1 - aBuf);
    WRITE_UTF8(zOut, iCode);

    /* Update the aStart[] array */
    aStart[0] = aStart[1];
    aStart[1] = aStart[2];
    aStart[2] = iNext;
  }

  return rc;
}